

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall wabt::WastParser::ParseIfExceptHeader(WastParser *this,IfExceptExpr *expr)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  Result RVar2;
  string *psVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_210;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_194;
  undefined1 local_193;
  allocator local_192;
  allocator local_191;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  string local_168 [32];
  iterator local_148;
  size_type local_140;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_138;
  Location local_120;
  Var local_100;
  Enum local_b8;
  Enum local_b4;
  int local_b0;
  Enum local_9c;
  Location local_98;
  undefined1 local_78 [8];
  Var var;
  IfExceptExpr *expr_local;
  WastParser *this_local;
  
  bVar1 = PeekMatchLpar(this,Result);
  if ((bVar1) || (bVar1 = PeekMatchLpar(this,Param), bVar1)) {
    RVar2 = ParseBlockDeclaration(this,&(expr->true_).decl);
    bVar1 = Failed(RVar2);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    RVar2 = ParseVar(this,&expr->except_var);
    bVar1 = Failed(RVar2);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    goto LAB_016e324d;
  }
  bVar1 = PeekMatch(this,Last_Literal);
  if (bVar1) {
    var.field_2._28_4_ = ParseVar(this,&expr->except_var);
    bVar1 = Failed((Result)var.field_2._28_4_);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    goto LAB_016e324d;
  }
  bVar1 = PeekMatch(this,Last_String);
  if (!bVar1) {
    local_193 = 1;
    local_190 = &local_188;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_188,"a var",&local_191);
    local_190 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_168,"a block type",&local_192);
    local_193 = 0;
    local_148 = &local_188;
    local_140 = 2;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator(&local_194);
    __l._M_len = local_140;
    __l._M_array = local_148;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_138,__l,&local_194);
    this_local._4_4_ = ErrorExpected(this,&local_138,"12 or $foo or (result ...)");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_138);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator(&local_194);
    local_210 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_148;
    do {
      local_210 = local_210 + -1;
      std::__cxx11::string::~string((string *)local_210);
    } while (local_210 != &local_188);
    std::allocator<char>::~allocator((allocator<char> *)&local_192);
    std::allocator<char>::~allocator((allocator<char> *)&local_191);
    return (Result)this_local._4_4_;
  }
  Location::Location(&local_98);
  Var::Var((Var *)local_78,0xffffffff,&local_98);
  local_9c = (Enum)ParseVar(this,(Var *)local_78);
  bVar1 = Failed((Result)local_9c);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
    local_b0 = 1;
  }
  else {
    bVar1 = PeekMatchLpar(this,Result);
    if ((bVar1) || (bVar1 = PeekMatchLpar(this,Param), bVar1)) {
      psVar3 = Var::name_abi_cxx11_((Var *)local_78);
      std::__cxx11::string::operator=((string *)&expr->true_,(string *)psVar3);
      local_b4 = (Enum)ParseBlockDeclaration(this,&(expr->true_).decl);
      bVar1 = Failed((Result)local_b4);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        local_b0 = 1;
      }
      else {
        local_b8 = (Enum)ParseVar(this,&expr->except_var);
        bVar1 = Failed((Result)local_b8);
        if (!bVar1) goto LAB_016e2f59;
        Result::Result((Result *)((long)&this_local + 4),Error);
        local_b0 = 1;
      }
    }
    else {
      Location::Location(&local_120);
      Var::Var(&local_100,0xffffffff,&local_120);
      bVar1 = ParseVarOpt(this,&expr->except_var,&local_100);
      Var::~Var(&local_100);
      if (bVar1) {
        psVar3 = Var::name_abi_cxx11_((Var *)local_78);
        std::__cxx11::string::operator=((string *)&expr->true_,(string *)psVar3);
      }
      else {
        Var::operator=(&expr->except_var,(Var *)local_78);
      }
LAB_016e2f59:
      local_b0 = 0;
    }
  }
  Var::~Var((Var *)local_78);
  if (local_b0 != 0) {
    return (Result)this_local._4_4_;
  }
LAB_016e324d:
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseIfExceptHeader(IfExceptExpr* expr) {
  WABT_TRACE(ParseIfExceptHeader);
  // if_except has the syntax:
  //
  //     if_except label_opt block_type except_index
  //
  // This means that it can have a few different forms:
  //
  //     1. if_except <num> ...
  //     2. if_except $except ...
  //     3. if_except $label $except/<num> ...
  //     4. if_except (result...) $except/<num> ...
  //     5. if_except $label (result...) $except/<num> ...
  //
  // With the multi-value proposal, `block_type` can be (param...) (result...),
  // so there are more forms:
  //
  //     6. if_except (param...) $except/<num> ...
  //     7. if_except (param...) (result...) $except/<num> ...
  //     8. if_except $label (param...) $except/<num> ...
  //     9. if_except $label (param...) (result...) $except/<num> ...
  //
  // This case is handled by ParseBlockDeclaration, but it means we also need
  // to check for the `param` token here.

  if (PeekMatchLpar(TokenType::Result) || PeekMatchLpar(TokenType::Param)) {
    // Cases 4, 6, 7.
    CHECK_RESULT(ParseBlockDeclaration(&expr->true_.decl));
    CHECK_RESULT(ParseVar(&expr->except_var));
  } else if (PeekMatch(TokenType::Nat)) {
    // Case 1.
    CHECK_RESULT(ParseVar(&expr->except_var));
  } else if (PeekMatch(TokenType::Var)) {
    // Cases 2, 3, 5, 8, 9.
    Var var;
    CHECK_RESULT(ParseVar(&var));
    if (PeekMatchLpar(TokenType::Result) || PeekMatchLpar(TokenType::Param)) {
      // Cases 5, 8, 9.
      expr->true_.label = var.name();
      CHECK_RESULT(ParseBlockDeclaration(&expr->true_.decl));
      CHECK_RESULT(ParseVar(&expr->except_var));
    } else if (ParseVarOpt(&expr->except_var, Var())) {
      // Case 3.
      expr->true_.label = var.name();
    } else {
      // Case 2.
      expr->except_var = var;
    }
  } else {
    return ErrorExpected({"a var", "a block type"},
                         "12 or $foo or (result ...)");
  }

  return Result::Ok;
}